

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_output.cpp
# Opt level: O0

bool tokens_to_json(char *file_name,Lexer *lexer)

{
  bool bVar1;
  string s;
  string *in_stack_000000a8;
  char *in_stack_000000b0;
  string *in_stack_ffffffffffffffc8;
  Lexer *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8);
  bVar1 = get_tokens_as_string(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (bVar1) {
    append_content(in_stack_000000b0,in_stack_000000a8);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return bVar1;
}

Assistant:

bool tokens_to_json(const char * file_name, Lexer & lexer)
{
  string s;
  if (!get_tokens_as_string(lexer, s))
    return false;

  append_content(file_name, s);
  return true;
}